

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-sockets.c
# Opt level: O2

int lws_interface_to_sa(int ipv6,char *ifname,sockaddr_in *addr,size_t addrlen)

{
  sockaddr *psVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  uint *puVar6;
  ifaddrs *piVar7;
  ifaddrs *ifr;
  
  piVar7 = (ifaddrs *)&ifr;
  iVar4 = getifaddrs(piVar7);
  if (iVar4 == 0) {
    iVar4 = -1;
    while ((piVar7 = piVar7->ifa_next, piVar7 != (ifaddrs *)0x0 && (iVar4 != 0))) {
      if ((piVar7->ifa_addr != (sockaddr *)0x0) && (piVar7->ifa_name != (char *)0x0)) {
        _lws_log(0x10," interface %s vs %s (fam %d) ipv6 %d\n",piVar7->ifa_name,ifname,
                 (ulong)piVar7->ifa_addr->sa_family,ipv6);
        iVar5 = strcmp(piVar7->ifa_name,ifname);
        if (iVar5 == 0) {
          psVar1 = piVar7->ifa_addr;
          if (psVar1->sa_family == 2) {
            uVar2._0_2_ = psVar1->sa_family;
            uVar2._2_1_ = psVar1->sa_data[0];
            uVar2._3_1_ = psVar1->sa_data[1];
            uVar2._4_1_ = psVar1->sa_data[2];
            uVar2._5_1_ = psVar1->sa_data[3];
            uVar2._6_1_ = psVar1->sa_data[4];
            uVar2._7_1_ = psVar1->sa_data[5];
            uVar3 = *(undefined8 *)(psVar1->sa_data + 6);
            addr->sin_family = (undefined2)uVar2;
            addr->sin_port = (short)((ulong)uVar2 >> 0x10);
            addr->sin_addr = (in_addr)(int)((ulong)uVar2 >> 0x20);
            *(undefined8 *)addr->sin_zero = uVar3;
            iVar4 = 0;
          }
          else if (psVar1->sa_family == 0x11) {
            iVar4 = -2;
          }
        }
      }
    }
    freeifaddrs(ifr);
    if (iVar4 == 0) {
      iVar4 = 0;
    }
    else {
      iVar5 = lws_sa46_parse_numeric_address(ifname,(lws_sockaddr46 *)addr);
      if (iVar5 == 0) {
        iVar4 = 0;
      }
    }
  }
  else {
    puVar6 = (uint *)__errno_location();
    iVar4 = 0;
    _lws_log(1,"%s: unable to getifaddrs: errno %d\n","lws_interface_to_sa",(ulong)*puVar6);
  }
  return iVar4;
}

Assistant:

int
lws_interface_to_sa(int ipv6, const char *ifname, struct sockaddr_in *addr,
		    size_t addrlen)
{
	int rc = LWS_ITOSA_NOT_EXIST;

	struct ifaddrs *ifr;
	struct ifaddrs *ifc;
#ifdef LWS_WITH_IPV6
	struct sockaddr_in6 *addr6 = (struct sockaddr_in6 *)addr;
#endif

	if (getifaddrs(&ifr)) {
		lwsl_err("%s: unable to getifaddrs: errno %d\n", __func__, errno);

		return LWS_ITOSA_USABLE;
	}
	for (ifc = ifr; ifc != NULL && rc; ifc = ifc->ifa_next) {
		if (!ifc->ifa_addr || !ifc->ifa_name)
			continue;

		lwsl_debug(" interface %s vs %s (fam %d) ipv6 %d\n",
			   ifc->ifa_name, ifname,
			   ifc->ifa_addr->sa_family, ipv6);

		if (strcmp(ifc->ifa_name, ifname))
			continue;

		switch (ifc->ifa_addr->sa_family) {
#if defined(AF_PACKET)
		case AF_PACKET:
			/* interface exists but is not usable */
			rc = LWS_ITOSA_NOT_USABLE;
			continue;
#endif

		case AF_INET:
#ifdef LWS_WITH_IPV6
			if (ipv6) {
				/* map IPv4 to IPv6 */
				memset((char *)&addr6->sin6_addr, 0,
						sizeof(struct in6_addr));
				addr6->sin6_addr.s6_addr[10] = 0xff;
				addr6->sin6_addr.s6_addr[11] = 0xff;
				memcpy(&addr6->sin6_addr.s6_addr[12],
				       &((struct sockaddr_in *)ifc->ifa_addr)->sin_addr,
							sizeof(struct in_addr));
				lwsl_debug("%s: uplevelling ipv4 bind to ipv6\n", __func__);
			} else
#endif
				memcpy(addr,
					(struct sockaddr_in *)ifc->ifa_addr,
						    sizeof(struct sockaddr_in));
			break;
#ifdef LWS_WITH_IPV6
		case AF_INET6:
			memcpy(&addr6->sin6_addr,
			  &((struct sockaddr_in6 *)ifc->ifa_addr)->sin6_addr,
						       sizeof(struct in6_addr));
			break;
#endif
		default:
			continue;
		}
		rc = LWS_ITOSA_USABLE;
	}

	freeifaddrs(ifr);

	if (rc &&
	    !lws_sa46_parse_numeric_address(ifname, (lws_sockaddr46 *)addr))
		rc = LWS_ITOSA_USABLE;

	return rc;
}